

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

string * __thiscall
booster::locale::impl_std::utf8_numpunct::do_grouping_abi_cxx11_
          (string *__return_storage_ptr__,utf8_numpunct *this)

{
  char cVar1;
  
  cVar1 = *(char *)(*(long *)&this->field_0x10 + 0x49);
  if (cVar1 == -0x60 || -1 < cVar1) {
    std::__cxx11::numpunct<char>::do_grouping();
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string do_grouping() const
    {
        unsigned char bs = base_type::do_thousands_sep();
        if(bs > 127 && bs != 0xA0)
            return std::string();
        return base_type::do_grouping();
    }